

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_reduce.cpp
# Opt level: O1

void __thiscall tst_helpers_reduce::sequenceTypes(tst_helpers_reduce *this)

{
  int *piVar1;
  QSharedData *pQVar2;
  _List_node_base **pp_Var3;
  long lVar4;
  long *plVar5;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QVar6;
  QArrayData *pQVar7;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar9;
  bool bVar10;
  char cVar11;
  PromiseData<int> *pPVar12;
  PromiseData<int> *pPVar13;
  char *pcVar14;
  char *pcVar15;
  const_iterator cVar16;
  long lVar17;
  PromiseData<int> *tmp;
  _List_node_base *p_Var18;
  QPromiseReject<int> *in_R8;
  char *reject;
  int iVar19;
  PromiseData<int> *tmp_3;
  PromiseData<int> *tmp_1;
  _func_int **pp_Var20;
  initializer_list<QtPromise::QPromise<int>_> __l;
  initializer_list<QtPromise::QPromise<int>_> __l_00;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_2b0 [2];
  QArrayData *d;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> local_298;
  QPromiseBase<int> local_290;
  QPromiseBase<int> local_280;
  PromiseData<int> *local_270;
  int local_268;
  PromiseData<int> *local_260;
  PromiseData<int> *local_258;
  PromiseData<int> *local_250;
  _List_node_base *local_248;
  PromiseData<int> *local_240;
  PromiseData<int> *local_238;
  int local_230;
  Type p1_1;
  PromiseResolver<int> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> local_210;
  QPromise<int> local_208;
  Type p1;
  QVector<int> v0;
  list<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> inputs;
  Type p0;
  QPromiseBase<int> local_170;
  PromiseResolver<int> resolver_3;
  QVector<int> v1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_138;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_130;
  _Any_data local_128;
  code *local_118;
  QVector<int> v1_1;
  PromiseResolver<int> resolver;
  PromiseData<int> *local_c0;
  long *local_b8;
  _func_int **local_b0;
  _Any_data local_a8;
  code *local_98;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _func_int **local_60;
  undefined4 local_54;
  _Any_data local_50;
  code *local_40;
  
  anon_unknown.dwarf_57107::SequenceTester<QList<QtPromise::QPromise<int>_>_>::exec();
  anon_unknown.dwarf_57107::SequenceTester<QList<QtPromise::QPromise<int>_>_>::exec();
  local_128._0_4_ = 4;
  QtPromise::resolve<int>((int *)&local_258);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            ((QPromiseBase<int> *)&d,(anon_class_4_1_898ef5c2)(int)&local_258);
  resolver.m_d.d._0_4_ = 6;
  QtPromise::resolve<int>((int *)&v0);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            (&local_290,(anon_class_4_1_898ef5c2)(int)&v0);
  local_a8._0_4_ = 8;
  QtPromise::resolve<int>((int *)&v1);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            (&local_280,(anon_class_4_1_898ef5c2)(int)&v1);
  __l._M_len = 3;
  __l._M_array = (iterator)&d;
  std::__cxx11::list<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>::list
            (&inputs,__l,(allocator_type *)local_88._M_pod_data);
  lVar17 = 0x30;
  local_2b0[0].d = (Data *)&PTR__QPromiseBase_0013e890;
  do {
    *(Data **)((long)&local_2b0[0].d + lVar17) = local_2b0[0].d;
    lVar4 = *(long *)((long)&local_2b0[1].d + lVar17);
    if (lVar4 != 0) {
      LOCK();
      piVar1 = (int *)(lVar4 + 8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) &&
         (plVar5 = *(long **)((long)&local_2b0[1].d + lVar17), plVar5 != (long *)0x0)) {
        (**(code **)(*plVar5 + 8))();
      }
    }
    lVar17 = lVar17 + -0x10;
  } while (lVar17 != 0);
  v1.d.d = (Data *)local_2b0[0].d;
  if (v1.d.ptr != (int *)0x0) {
    LOCK();
    piVar1 = v1.d.ptr + 2;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if ((*piVar1 == 0) && (v1.d.ptr != (int *)0x0)) {
      (**(code **)(*(long *)v1.d.ptr + 8))();
    }
  }
  v0.d.d = (Data *)local_2b0[0].d;
  if (v0.d.ptr != (int *)0x0) {
    LOCK();
    piVar1 = v0.d.ptr + 2;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if ((*piVar1 == 0) && (v0.d.ptr != (int *)0x0)) {
      (**(code **)(*(long *)v0.d.ptr + 8))();
    }
  }
  local_258 = (PromiseData<int> *)local_2b0[0].d;
  if (local_250 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &(local_250->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_250 != (PromiseData<int> *)0x0)) {
      (*(code *)((_List_node_base *)
                (local_250->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase)->
                _M_prev)();
    }
  }
  v0.d.size = 0;
  v0.d.d = (Data *)0x0;
  v0.d.ptr = (int *)0x0;
  v1.d.size = 0;
  v1.d.d = (Data *)0x0;
  v1.d.ptr = (int *)0x0;
  p0.super_QPromiseBase<int>.m_d.d =
       (PromiseData<int> *)
       inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>
       ._M_impl._M_node.super__List_node_base._M_next[1]._M_prev;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_2b0[1].d = (Data *)&PTR__QPromiseBase_0013e8f0;
  p0.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0013e8f0;
  p_Var18 = (inputs.
             super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
             _M_impl._M_node.super__List_node_base._M_next)->_M_next;
  if (p_Var18 != (_List_node_base *)&inputs) {
    iVar19 = 1;
    do {
      local_260 = (PromiseData<int> *)p_Var18[1]._M_prev;
      if (local_260 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_260->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        pQVar2 = &(local_260->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_258 = (PromiseData<int> *)local_2b0[1].d;
      local_248 = (_List_node_base *)&v0;
      local_238 = p0.super_QPromiseBase<int>.m_d.d;
      if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &((p0.super_QPromiseBase<int>.m_d.d)->
                  super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_240 = (PromiseData<int> *)local_2b0[1].d;
      local_250 = local_260;
      local_230 = iVar19;
      pPVar12 = (PromiseData<int> *)operator_new(0x68);
      (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
           (_func_int **)0x0;
      *(undefined8 *)&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData =
           0;
      (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
           (void *)0x0;
      (pPVar12->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
      (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
      (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
      (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
      (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      *(undefined8 *)&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
      *(undefined8 *)&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
      (pPVar12->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
           (_func_int **)&PTR__PromiseDataBase_0013e9a0;
      QReadWriteLock::QReadWriteLock
                (&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
      QVar6.d = local_2b0[0].d;
      (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
      (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
      (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
      (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
      (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
      (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
           (void *)0x0;
      (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
           (_func_int **)&PTR__PromiseData_0013e928;
      (pPVar12->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pPVar12->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      LOCK();
      pQVar2 = &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      pQVar2 = &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_128._M_unused._M_object = local_2b0[1].d;
      local_128._8_8_ = pPVar12;
      QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver,(QPromise<int> *)&local_128)
      ;
      local_128._M_unused._M_object = QVar6.d;
      if ((PromiseData<int> *)local_128._8_8_ != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = (QSharedData *)(local_128._8_8_ + 8);
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) &&
           ((PromiseData<int> *)local_128._8_8_ != (PromiseData<int> *)0x0)) {
          (**(code **)(*(long *)local_128._8_8_ + 8))();
        }
      }
      QVar9.d = p0.super_QPromiseBase<int>.m_d.d;
      if (resolver.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
        UNLOCK();
      }
      local_a8._M_unused._M_object = (void *)resolver.m_d.d;
      if (resolver.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
        UNLOCK();
      }
      p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)resolver.m_d.d;
      d = (QArrayData *)resolver.m_d.d;
      if (resolver.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
        UNLOCK();
      }
      local_298.d = (PromiseData<int> *)resolver.m_d.d;
      if (resolver.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
        UNLOCK();
      }
      local_290.m_d.d = local_250;
      if (local_250 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_250->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_290._vptr_QPromiseBase = (_func_int **)local_2b0[1].d;
      local_280._vptr_QPromiseBase = (_func_int **)local_248;
      local_270 = local_238;
      if (local_238 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_238->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_280.m_d.d = (PromiseData<int> *)local_2b0[1].d;
      local_268 = local_230;
      local_88._M_unused._M_object = (void *)0x0;
      local_88._8_8_ = 0;
      local_78 = (code *)0x0;
      pcStack_70 = (code *)0x0;
      local_88._M_unused._M_object = operator_new(0x40);
      *(QArrayData **)local_88._M_unused._0_8_ = d;
      if (d != (QArrayData *)0x0) {
        LOCK();
        (d->ref_)._q_value.super___atomic_base<int>._M_i =
             (d->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(PromiseData<int> **)((long)local_88._M_unused._0_8_ + 8) = local_298.d;
      if (local_298.d != (PromiseData<int> *)0x0) {
        LOCK();
        (((QAtomicInt *)
         &((local_298.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase)->
        super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
        _M_i = (((QAtomicInt *)
                &((local_298.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                 _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
               _q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(Data **)((long)local_88._M_unused._0_8_ + 0x10) = local_2b0[0].d;
      *(PromiseData<int> **)((long)local_88._M_unused._0_8_ + 0x18) = local_290.m_d.d;
      if (local_290.m_d.d != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &((local_290.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                  super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(Data **)((long)local_88._M_unused._0_8_ + 0x10) = local_2b0[1].d;
      *(_func_int ***)((long)local_88._M_unused._0_8_ + 0x20) = local_280._vptr_QPromiseBase;
      *(Data **)((long)local_88._M_unused._0_8_ + 0x28) = local_2b0[0].d;
      *(PromiseData<int> **)((long)local_88._M_unused._0_8_ + 0x30) = local_270;
      if (local_270 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_270->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(Data **)((long)local_88._M_unused._0_8_ + 0x28) = local_2b0[1].d;
      *(int *)((long)local_88._M_unused._0_8_ + 0x38) = local_268;
      pcStack_70 = std::
                   _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                   ::_M_invoke;
      local_78 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_manager;
      local_280.m_d.d = (PromiseData<int> *)local_2b0[0].d;
      if (local_270 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_270->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (local_270 != (PromiseData<int> *)0x0)) {
          (*(local_270->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
        }
      }
      local_290._vptr_QPromiseBase = (_func_int **)local_2b0[0].d;
      if (local_290.m_d.d != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &((local_290.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                  super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (local_290.m_d.d != (PromiseData<int> *)0x0)) {
          (*(code *)((_List_node_base *)
                    ((local_290.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                    _vptr_PromiseDataBase)->_M_prev)();
        }
      }
      if (local_298.d != (PromiseData<int> *)0x0) {
        LOCK();
        (((QAtomicInt *)
         &((local_298.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase)->
        super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
        _M_i = (((QAtomicInt *)
                &((local_298.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                 _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
               _q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((((QAtomicInt *)
              &((local_298.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase
              )->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (local_298.d != (PromiseData<int> *)0x0)) {
          operator_delete(local_298.d,0x10);
        }
      }
      if (d != (QArrayData *)0x0) {
        LOCK();
        (d->ref_)._q_value.super___atomic_base<int>._M_i =
             (d->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((d->ref_)._q_value.super___atomic_base<int>._M_i == 0) && (d != (QArrayData *)0x0)) {
          operator_delete(d,0x10);
        }
      }
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
                (&(QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
                 (function<void_(const_int_&)> *)&local_88);
      if (local_78 != (code *)0x0) {
        (*local_78)(&local_88,&local_88,__destroy_functor);
      }
      QVar9.d = p0.super_QPromiseBase<int>.m_d.d;
      QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
      create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
                ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
                 (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_a8,
                 (QPromiseResolve<int> *)&p1,in_R8);
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
                (&(QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
                 (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      if (p1.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0) {
        LOCK();
        *(int *)p1.super_QPromiseBase<int>._vptr_QPromiseBase =
             *(int *)p1.super_QPromiseBase<int>._vptr_QPromiseBase + -1;
        UNLOCK();
        if ((*(int *)p1.super_QPromiseBase<int>._vptr_QPromiseBase == 0) &&
           (p1.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0)) {
          operator_delete(p1.super_QPromiseBase<int>._vptr_QPromiseBase,0x10);
        }
      }
      if ((Data *)local_a8._M_unused._0_8_ != (Data *)0x0) {
        LOCK();
        *(int *)local_a8._M_unused._0_8_ = *local_a8._M_unused._M_object + -1;
        UNLOCK();
        if ((*local_a8._M_unused._M_object == 0) &&
           ((Data *)local_a8._M_unused._0_8_ != (Data *)0x0)) {
          operator_delete(local_a8._M_unused._M_object,0x10);
        }
      }
      if (resolver.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
        UNLOCK();
        if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
          operator_delete((void *)resolver.m_d.d,0x10);
        }
      }
      QVar9.d = p0.super_QPromiseBase<int>.m_d.d;
      bVar10 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                         (&(p0.super_QPromiseBase<int>.m_d.d)->
                           super_PromiseDataBase<int,_void_(const_int_&)>);
      if (!bVar10) {
        QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                  (&(QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
      }
      LOCK();
      pQVar2 = &((QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      p0.super_QPromiseBase<int>.m_d.d = pPVar12;
      if ((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*((QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])
                  (QVar9.d);
      }
      local_240 = (PromiseData<int> *)local_2b0[0].d;
      if (local_238 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_238->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (local_238 != (PromiseData<int> *)0x0)) {
          (*(local_238->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
        }
      }
      local_258 = (PromiseData<int> *)local_2b0[0].d;
      if (local_250 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_250->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (local_250 != (PromiseData<int> *)0x0)) {
          (*(code *)((_List_node_base *)
                    (local_250->super_PromiseDataBase<int,_void_(const_int_&)>).
                    _vptr_PromiseDataBase)->_M_prev)();
        }
      }
      if (local_260 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_260->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i == 0) {
          (*(code *)((_List_node_base *)
                    (local_260->super_PromiseDataBase<int,_void_(const_int_&)>).
                    _vptr_PromiseDataBase)->_M_prev)();
        }
      }
      p_Var18 = (((_List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>
                   *)&p_Var18->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      iVar19 = iVar19 + 1;
    } while (p_Var18 != (_List_node_base *)&inputs);
  }
  local_c0 = (PromiseData<int> *)CONCAT44(local_c0._4_4_,2);
  QtPromise::resolve<int>((int *)&local_208);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            ((QPromiseBase<int> *)&v1_1,(anon_class_4_1_898ef5c2)(int)&local_208);
  p1.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)v1_1.d.ptr;
  v1_1.d.ptr = (int *)0x0;
  p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)local_2b0[1].d;
  if (inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
      _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&inputs) {
    iVar19 = 0;
    p_Var18 = inputs.
              super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    do {
      pPVar12 = (PromiseData<int> *)p_Var18[1]._M_prev;
      if (pPVar12 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        pQVar2 = &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_258 = (PromiseData<int> *)local_2b0[1].d;
      local_248 = (_List_node_base *)&v1;
      local_238 = p1.super_QPromiseBase<int>.m_d.d;
      if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &((p1.super_QPromiseBase<int>.m_d.d)->
                  super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_240 = (PromiseData<int> *)local_2b0[1].d;
      local_250 = pPVar12;
      local_230 = iVar19;
      pPVar13 = (PromiseData<int> *)operator_new(0x68);
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
           (_func_int **)0x0;
      *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData =
           0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
           (void *)0x0;
      (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
      *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
      (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
           (_func_int **)&PTR__PromiseDataBase_0013e9a0;
      QReadWriteLock::QReadWriteLock
                (&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
      QVar6.d = local_2b0[0].d;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
           (void *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
           (_func_int **)&PTR__PromiseData_0013e928;
      (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      LOCK();
      pQVar2 = &(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      pQVar2 = &(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_128._M_unused._M_object = local_2b0[1].d;
      local_260 = pPVar12;
      local_128._8_8_ = pPVar13;
      QtPromisePrivate::PromiseResolver<int>::PromiseResolver
                (&resolver_1,(QPromise<int> *)&local_128);
      local_128._M_unused._M_object = QVar6.d;
      if ((PromiseData<int> *)local_128._8_8_ != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = (QSharedData *)(local_128._8_8_ + 8);
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) &&
           ((PromiseData<int> *)local_128._8_8_ != (PromiseData<int> *)0x0)) {
          (**(code **)(*(long *)local_128._8_8_ + 8))();
        }
      }
      QVar9.d = p1.super_QPromiseBase<int>.m_d.d;
      if (resolver_1.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
        UNLOCK();
      }
      p1_1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)resolver_1.m_d.d;
      if (resolver_1.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
        UNLOCK();
      }
      local_170._vptr_QPromiseBase = (_func_int **)resolver_1.m_d.d;
      d = (QArrayData *)resolver_1.m_d.d;
      if (resolver_1.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
        UNLOCK();
      }
      local_298.d = (PromiseData<int> *)resolver_1.m_d.d;
      if (resolver_1.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
        UNLOCK();
      }
      local_290.m_d.d = local_250;
      if (local_250 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_250->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_290._vptr_QPromiseBase = (_func_int **)local_2b0[1].d;
      local_280._vptr_QPromiseBase = (_func_int **)local_248;
      local_270 = local_238;
      if (local_238 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_238->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_280.m_d.d = (PromiseData<int> *)local_2b0[1].d;
      local_268 = local_230;
      resolver.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)(Data *)0x0;
      resolver.m_d.d =
           (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
           operator_new(0x40);
      *(QArrayData **)resolver.m_d.d = d;
      if (d != (QArrayData *)0x0) {
        LOCK();
        (d->ref_)._q_value.super___atomic_base<int>._M_i =
             (d->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ((Data *)resolver.m_d.d)->promise = (QPromise<int> *)local_298.d;
      if (local_298.d != (PromiseData<int> *)0x0) {
        LOCK();
        (((QAtomicInt *)
         &((local_298.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase)->
        super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
        _M_i = (((QAtomicInt *)
                &((local_298.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                 _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
               _q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(Data **)((long)resolver.m_d.d + 0x10) = local_2b0[0].d;
      ((Data *)((long)resolver.m_d.d + 0x10))->promise = (QPromise<int> *)local_290.m_d.d;
      if (local_290.m_d.d != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &((local_290.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                  super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(Data **)((long)resolver.m_d.d + 0x10) = local_2b0[1].d;
      *(_func_int ***)((long)resolver.m_d.d + 0x20) = local_280._vptr_QPromiseBase;
      ((Data *)((long)resolver.m_d.d + 0x20))->promise = (QPromise<int> *)local_2b0[0].d;
      *(PromiseData<int> **)((long)resolver.m_d.d + 0x30) = local_270;
      if (local_270 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_270->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ((Data *)((long)resolver.m_d.d + 0x20))->promise = (QPromise<int> *)local_2b0[1].d;
      *(int *)&((Data *)((long)resolver.m_d.d + 0x30))->promise = local_268;
      local_280.m_d.d = (PromiseData<int> *)local_2b0[0].d;
      if (local_270 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_270->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (local_270 != (PromiseData<int> *)0x0)) {
          (*(local_270->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
        }
      }
      local_290._vptr_QPromiseBase = (_func_int **)local_2b0[0].d;
      if (local_290.m_d.d != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &((local_290.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                  super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (local_290.m_d.d != (PromiseData<int> *)0x0)) {
          (*(code *)((_List_node_base *)
                    ((local_290.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                    _vptr_PromiseDataBase)->_M_prev)();
        }
      }
      if (local_298.d != (PromiseData<int> *)0x0) {
        LOCK();
        (((QAtomicInt *)
         &((local_298.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase)->
        super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
        _M_i = (((QAtomicInt *)
                &((local_298.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                 _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
               _q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((((QAtomicInt *)
              &((local_298.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase
              )->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (local_298.d != (PromiseData<int> *)0x0)) {
          operator_delete(local_298.d,0x10);
        }
      }
      if (d != (QArrayData *)0x0) {
        LOCK();
        (d->ref_)._q_value.super___atomic_base<int>._M_i =
             (d->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((d->ref_)._q_value.super___atomic_base<int>._M_i == 0) && (d != (QArrayData *)0x0)) {
          operator_delete(d,0x10);
        }
      }
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
                (&(QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
                 (function<void_(const_int_&)> *)&resolver);
      std::
      _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
      ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
      QVar9 = p1.super_QPromiseBase<int>.m_d;
      QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
      create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
                ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_a8,
                 (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&p1_1,
                 (QPromiseResolve<int> *)&local_170,in_R8);
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
                (&(QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
                 (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_a8);
      if (local_98 != (code *)0x0) {
        (*local_98)(&local_a8,&local_a8,__destroy_functor);
      }
      if ((Data *)local_170._vptr_QPromiseBase != (Data *)0x0) {
        LOCK();
        (((QSharedData *)local_170._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)
              (((QSharedData *)local_170._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
        UNLOCK();
        if (((__int_type)
             (((QSharedData *)local_170._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
           ((Data *)local_170._vptr_QPromiseBase != (Data *)0x0)) {
          operator_delete(local_170._vptr_QPromiseBase,0x10);
        }
      }
      if (p1_1.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0) {
        LOCK();
        *(int *)p1_1.super_QPromiseBase<int>._vptr_QPromiseBase =
             *(int *)p1_1.super_QPromiseBase<int>._vptr_QPromiseBase + -1;
        UNLOCK();
        if ((*(int *)p1_1.super_QPromiseBase<int>._vptr_QPromiseBase == 0) &&
           (p1_1.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0)) {
          operator_delete(p1_1.super_QPromiseBase<int>._vptr_QPromiseBase,0x10);
        }
      }
      if (resolver_1.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
        UNLOCK();
        if ((*(int *)resolver_1.m_d.d == 0) && (resolver_1.m_d.d != (Data *)0x0)) {
          operator_delete((void *)resolver_1.m_d.d,0x10);
        }
      }
      QVar9.d = p1.super_QPromiseBase<int>.m_d.d;
      bVar10 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                         (&(p1.super_QPromiseBase<int>.m_d.d)->
                           super_PromiseDataBase<int,_void_(const_int_&)>);
      if (!bVar10) {
        QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                  (&(QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
      }
      LOCK();
      pQVar2 = &((QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      p1.super_QPromiseBase<int>.m_d.d = pPVar13;
      if ((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*((QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])
                  (QVar9.d);
      }
      local_240 = (PromiseData<int> *)local_2b0[0].d;
      if (local_238 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_238->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (local_238 != (PromiseData<int> *)0x0)) {
          (*(local_238->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
        }
      }
      pPVar12 = local_260;
      local_258 = (PromiseData<int> *)local_2b0[0].d;
      if (local_250 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_250->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (local_250 != (PromiseData<int> *)0x0)) {
          (*(code *)((_List_node_base *)
                    (local_250->super_PromiseDataBase<int,_void_(const_int_&)>).
                    _vptr_PromiseDataBase)->_M_prev)();
        }
      }
      if (pPVar12 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i == 0) {
          (*(code *)((_List_node_base *)
                    (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase)
                    ->_M_prev)(pPVar12);
        }
      }
      p_Var18 = (((_List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>
                   *)&p_Var18->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      iVar19 = iVar19 + 1;
    } while (p_Var18 != (_List_node_base *)&inputs);
  }
  v1_1.d.d = (Data *)local_2b0[0].d;
  if (v1_1.d.ptr != (int *)0x0) {
    LOCK();
    piVar1 = v1_1.d.ptr + 2;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if ((*piVar1 == 0) && (v1_1.d.ptr != (int *)0x0)) {
      (**(code **)(*(long *)v1_1.d.ptr + 8))();
    }
  }
  local_208.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)local_2b0[0].d;
  if (local_208.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &((local_208.super_QPromiseBase<int>.m_d.d)->
              super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_208.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_208.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  bVar10 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                     (&(p0.super_QPromiseBase<int>.m_d.d)->
                       super_PromiseDataBase<int,_void_(const_int_&)>);
  d = (QArrayData *)CONCAT71(d._1_7_,bVar10);
  local_258._0_1_ = 1;
  pcVar14 = QTest::toString<bool>((bool *)&d);
  pcVar15 = QTest::toString<bool>((bool *)&local_258);
  reject = "p0.isPending()";
  cVar11 = QTest::compare_helper
                     (bVar10,"Compared values are not the same",pcVar14,pcVar15,"p0.isPending()",
                      "true",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                      ,0x3d);
  if (cVar11 != '\0') {
    bVar10 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                       (&(p1.super_QPromiseBase<int>.m_d.d)->
                         super_PromiseDataBase<int,_void_(const_int_&)>);
    d = (QArrayData *)CONCAT71(d._1_7_,bVar10);
    local_258._0_1_ = 1;
    pcVar14 = QTest::toString<bool>((bool *)&d);
    pcVar15 = QTest::toString<bool>((bool *)&local_258);
    reject = "p1.isPending()";
    cVar11 = QTest::compare_helper
                       (bVar10,"Compared values are not the same",pcVar14,pcVar15,"p1.isPending()",
                        "true",
                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                        ,0x3e);
    if (cVar11 != '\0') {
      d = (QArrayData *)CONCAT44(d._4_4_,0xffffffff);
      iVar19 = waitForValue<int>(&p0,(int *)&d);
      reject = 
      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
      ;
      cVar11 = QTest::qCompare(iVar19,0x15,"waitForValue(p0, -1)","21",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                               ,0x3f);
      if (cVar11 != '\0') {
        d = (QArrayData *)CONCAT44(d._4_4_,0xffffffff);
        iVar19 = waitForValue<int>(&p1,(int *)&d);
        reject = 
        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
        ;
        cVar11 = QTest::qCompare(iVar19,0x17,"waitForValue(p1, -1)","23",
                                 "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                                 ,0x40);
        if (cVar11 != '\0') {
          cVar16.i = (int *)QArrayData::allocate(&d,4,8,6,KeepSize);
          pQVar7 = d;
          cVar16.i[0] = 4;
          cVar16.i[1] = 6;
          cVar16.i[2] = 1;
          cVar16.i[3] = 0xb;
          cVar16.i[4] = 8;
          cVar16.i[5] = 2;
          reject = "v0";
          bVar10 = QTest::_q_compareSequence<QList<int>::const_iterator,QList<int>::const_iterator>
                             ((const_iterator)v0.d.ptr,(const_iterator)(v0.d.ptr + v0.d.size),cVar16
                              ,(const_iterator)(cVar16.i + 6),"v0",
                              "(QVector<int>{4, 6, 1, 11, 8, 2})",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                              ,0x41);
          if (pQVar7 != (QArrayData *)0x0) {
            LOCK();
            (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar7,4,8);
            }
          }
          if (bVar10) {
            cVar16.i = (int *)QArrayData::allocate(&d,4,8,9,KeepSize);
            pQVar7 = d;
            cVar16.i[4] = 6;
            cVar16.i[5] = 1;
            cVar16.i[6] = 0xd;
            cVar16.i[7] = 8;
            cVar16.i[0] = 2;
            cVar16.i[1] = 4;
            cVar16.i[2] = 0;
            cVar16.i[3] = 6;
            cVar16.i[8] = 2;
            reject = "v1";
            QTest::_q_compareSequence<QList<int>::const_iterator,QList<int>::const_iterator>
                      ((const_iterator)v1.d.ptr,(const_iterator)(v1.d.ptr + v1.d.size),cVar16,
                       (const_iterator)(cVar16.i + 9),"v1",
                       "(QVector<int>{2, 4, 0, 6, 6, 1, 13, 8, 2})",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                       ,0x42);
            if (pQVar7 != (QArrayData *)0x0) {
              LOCK();
              (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar7,4,8);
              }
            }
          }
        }
      }
    }
  }
  p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)local_2b0[0].d;
  if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  p0.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)local_2b0[0].d;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (v1.d.d != (Data *)0x0) {
    LOCK();
    ((v1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((v1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((v1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(v1.d.d)->super_QArrayData,4,8);
    }
  }
  if (v0.d.d != (Data *)0x0) {
    LOCK();
    ((v0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((v0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((v0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(v0.d.d)->super_QArrayData,4,8);
    }
  }
  std::__cxx11::_List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>::
  _M_clear(&inputs.
            super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>);
  v1.d.d = (Data *)CONCAT44(v1.d.d._4_4_,4);
  QtPromise::resolve<int>((int *)&local_258);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            ((QPromiseBase<int> *)&d,(anon_class_4_1_898ef5c2)(int)&local_258);
  local_128._0_4_ = 6;
  QtPromise::resolve<int>((int *)&inputs);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            (&local_290,(anon_class_4_1_898ef5c2)(int)&inputs);
  p1.super_QPromiseBase<int>._vptr_QPromiseBase =
       (_func_int **)CONCAT44(p1.super_QPromiseBase<int>._vptr_QPromiseBase._4_4_,8);
  QtPromise::resolve<int>((int *)&v0);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            (&local_280,(anon_class_4_1_898ef5c2)(int)&v0);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&d;
  std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>::vector
            ((vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> *)&p0,
             __l_00,(allocator_type *)&v1_1);
  lVar17 = 0x30;
  do {
    *(Data **)((long)&local_2b0[0].d + lVar17) = local_2b0[0].d;
    lVar4 = *(long *)((long)&local_2b0[1].d + lVar17);
    if (lVar4 != 0) {
      LOCK();
      piVar1 = (int *)(lVar4 + 8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) &&
         (plVar5 = *(long **)((long)&local_2b0[1].d + lVar17), plVar5 != (long *)0x0)) {
        (**(code **)(*plVar5 + 8))();
      }
    }
    lVar17 = lVar17 + -0x10;
  } while (lVar17 != 0);
  v0.d.d = (Data *)local_2b0[0].d;
  if (v0.d.ptr != (int *)0x0) {
    LOCK();
    piVar1 = v0.d.ptr + 2;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if ((*piVar1 == 0) && (v0.d.ptr != (int *)0x0)) {
      (**(code **)(*(long *)v0.d.ptr + 8))();
    }
  }
  inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_2b0[0].d;
  if (inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
      _M_impl._M_node.super__List_node_base._M_prev != (_List_node_base *)0x0) {
    LOCK();
    pp_Var3 = &(inputs.
                super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>
                ._M_impl._M_node.super__List_node_base._M_prev)->_M_prev;
    *(int *)pp_Var3 = *(int *)pp_Var3 + -1;
    UNLOCK();
    if ((*(int *)pp_Var3 == 0) &&
       (inputs.
        super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
        _M_impl._M_node.super__List_node_base._M_prev != (_List_node_base *)0x0)) {
      (*(code *)(inputs.
                 super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>
                 ._M_impl._M_node.super__List_node_base._M_prev)->_M_next->_M_prev)();
    }
  }
  local_258 = (PromiseData<int> *)local_2b0[0].d;
  if (local_250 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &(local_250->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_250 != (PromiseData<int> *)0x0)) {
      (*(code *)((_List_node_base *)
                (local_250->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase)->
                _M_prev)();
    }
  }
  QVar6.d = local_2b0[0].d;
  p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  p1.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x0;
  v1_1.d.size = 0;
  v1_1.d.d = (Data *)0x0;
  v1_1.d.ptr = (int *)0x0;
  local_210.d = (PromiseData<int> *)p0.super_QPromiseBase<int>._vptr_QPromiseBase[1];
  if (local_210.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &((local_210.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)local_2b0[1].d;
  pPVar12 = (PromiseData<int> *)(p0.super_QPromiseBase<int>._vptr_QPromiseBase + 2);
  if (pPVar12 != p0.super_QPromiseBase<int>.m_d.d) {
    iVar19 = 1;
    local_b0 = (_func_int **)&PTR__PromiseData_0013e928;
    do {
      local_260 = *(PromiseData<int> **)
                   &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      if (local_260 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_260->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        pQVar2 = &(local_260->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_258 = (PromiseData<int> *)local_2b0[1].d;
      local_248 = (_List_node_base *)&p1;
      local_238 = local_210.d;
      if (local_210.d != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &((local_210.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_240 = (PromiseData<int> *)local_2b0[1].d;
      local_250 = local_260;
      local_230 = iVar19;
      pPVar13 = (PromiseData<int> *)operator_new(0x68);
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
           (_func_int **)0x0;
      *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData =
           0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
           (void *)0x0;
      (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
      *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
      (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
           (_func_int **)&PTR__PromiseDataBase_0013e9a0;
      QReadWriteLock::QReadWriteLock
                (&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
           (void *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = local_b0;
      (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      LOCK();
      pQVar2 = &(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      pQVar2 = &(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)local_2b0[1].d;
      inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
      _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pPVar13;
      QtPromisePrivate::PromiseResolver<int>::PromiseResolver
                ((PromiseResolver<int> *)&v0,(QPromise<int> *)&inputs);
      inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)QVar6.d;
      if (inputs.
          super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
          _M_impl._M_node.super__List_node_base._M_prev != (_List_node_base *)0x0) {
        LOCK();
        pp_Var3 = &(inputs.
                    super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>
                    ._M_impl._M_node.super__List_node_base._M_prev)->_M_prev;
        *(int *)pp_Var3 = *(int *)pp_Var3 + -1;
        UNLOCK();
        if ((*(int *)pp_Var3 == 0) &&
           (inputs.
            super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
            _M_impl._M_node.super__List_node_base._M_prev != (_List_node_base *)0x0)) {
          (*(code *)(inputs.
                     super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>
                     ._M_impl._M_node.super__List_node_base._M_prev)->_M_next->_M_prev)();
        }
      }
      if (v0.d.d != (Data *)0x0) {
        LOCK();
        ((v0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((v0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_208.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)v0.d.d;
      if (v0.d.d != (Data *)0x0) {
        LOCK();
        ((v0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((v0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      p1_1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)v0.d.d;
      d = &(v0.d.d)->super_QArrayData;
      if (v0.d.d != (Data *)0x0) {
        LOCK();
        ((v0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((v0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_298.d = (PromiseData<int> *)v0.d.d;
      if (v0.d.d != (Data *)0x0) {
        LOCK();
        ((v0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((v0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_290.m_d.d = local_250;
      if (local_250 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_250->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_290._vptr_QPromiseBase = (_func_int **)local_2b0[1].d;
      local_280._vptr_QPromiseBase = (_func_int **)local_248;
      local_270 = local_238;
      if (local_238 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_238->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_280.m_d.d = (PromiseData<int> *)local_2b0[1].d;
      local_268 = local_230;
      v1.d.d = (Data *)0x0;
      v1.d.ptr = (int *)0x0;
      v1.d.size = 0;
      v1.d.d = (Data *)operator_new(0x40);
      *(QArrayData **)&(v1.d.d)->super_QArrayData = d;
      if (d != (QArrayData *)0x0) {
        LOCK();
        (d->ref_)._q_value.super___atomic_base<int>._M_i =
             (d->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      ((v1.d.d)->super_QArrayData).alloc = (qsizetype)local_298.d;
      if (local_298.d != (PromiseData<int> *)0x0) {
        LOCK();
        (((QAtomicInt *)
         &((local_298.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase)->
        super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
        _M_i = (((QAtomicInt *)
                &((local_298.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                 _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
               _q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(Data **)&v1.d.d[1].super_QArrayData = local_2b0[0].d;
      v1.d.d[1].super_QArrayData.alloc = (qsizetype)local_290.m_d.d;
      if (local_290.m_d.d != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &((local_290.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                  super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      *(Data **)&v1.d.d[1].super_QArrayData = local_2b0[1].d;
      *(_func_int ***)&v1.d.d[2].super_QArrayData = local_280._vptr_QPromiseBase;
      v1.d.d[2].super_QArrayData.alloc = (qsizetype)local_2b0[0].d;
      *(PromiseData<int> **)&v1.d.d[3].super_QArrayData = local_270;
      if (local_270 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_270->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      v1.d.d[2].super_QArrayData.alloc = (qsizetype)local_2b0[1].d;
      *(int *)&v1.d.d[3].super_QArrayData.alloc = local_268;
      v1.d.size = (qsizetype)
                  std::
                  _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                  ::_M_manager;
      local_280.m_d.d = (PromiseData<int> *)local_2b0[0].d;
      if (local_270 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_270->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (local_270 != (PromiseData<int> *)0x0)) {
          (*(local_270->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
        }
      }
      local_290._vptr_QPromiseBase = (_func_int **)local_2b0[0].d;
      if (local_290.m_d.d != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &((local_290.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                  super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (local_290.m_d.d != (PromiseData<int> *)0x0)) {
          (*(code *)((_List_node_base *)
                    ((local_290.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                    _vptr_PromiseDataBase)->_M_prev)();
        }
      }
      if (local_298.d != (PromiseData<int> *)0x0) {
        LOCK();
        (((QAtomicInt *)
         &((local_298.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase)->
        super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
        _M_i = (((QAtomicInt *)
                &((local_298.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                 _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
               _q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((((QAtomicInt *)
              &((local_298.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase
              )->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (local_298.d != (PromiseData<int> *)0x0)) {
          operator_delete(local_298.d,0x10);
        }
      }
      if (d != (QArrayData *)0x0) {
        LOCK();
        (d->ref_)._q_value.super___atomic_base<int>._M_i =
             (d->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((d->ref_)._q_value.super___atomic_base<int>._M_i == 0) && (d != (QArrayData *)0x0)) {
          operator_delete(d,0x10);
        }
      }
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
                (&(local_210.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
                 (function<void_(const_int_&)> *)&v1);
      if (v1.d.size != 0) {
        (*(code *)v1.d.size)(&v1,&v1,3);
      }
      QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
      create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
                ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_128,
                 (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_208,
                 (QPromiseResolve<int> *)&p1_1,(QPromiseReject<int> *)reject);
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
                (&(local_210.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
                 (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_128);
      if (local_118 != (code *)0x0) {
        (*local_118)(&local_128,&local_128,__destroy_functor);
      }
      if (p1_1.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0) {
        LOCK();
        *(int *)p1_1.super_QPromiseBase<int>._vptr_QPromiseBase =
             *(int *)p1_1.super_QPromiseBase<int>._vptr_QPromiseBase + -1;
        UNLOCK();
        if ((*(int *)p1_1.super_QPromiseBase<int>._vptr_QPromiseBase == 0) &&
           (p1_1.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0)) {
          operator_delete(p1_1.super_QPromiseBase<int>._vptr_QPromiseBase,0x10);
        }
      }
      if ((PromiseData<int> *)local_208.super_QPromiseBase<int>._vptr_QPromiseBase !=
          (PromiseData<int> *)0x0) {
        LOCK();
        (((QAtomicInt *)
         &((PromiseDataBase<int,_void_(const_int_&)> *)
          local_208.super_QPromiseBase<int>._vptr_QPromiseBase)->_vptr_PromiseDataBase)->
        super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
        _M_i = (((QAtomicInt *)
                &((PromiseDataBase<int,_void_(const_int_&)> *)
                 local_208.super_QPromiseBase<int>._vptr_QPromiseBase)->_vptr_PromiseDataBase)->
               super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((((QAtomicInt *)
              &((PromiseDataBase<int,_void_(const_int_&)> *)
               local_208.super_QPromiseBase<int>._vptr_QPromiseBase)->_vptr_PromiseDataBase)->
             super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) &&
           ((PromiseData<int> *)local_208.super_QPromiseBase<int>._vptr_QPromiseBase !=
            (PromiseData<int> *)0x0)) {
          operator_delete(local_208.super_QPromiseBase<int>._vptr_QPromiseBase,0x10);
        }
      }
      if (v0.d.d != (Data *)0x0) {
        LOCK();
        ((v0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((v0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((v0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) &&
           (v0.d.d != (Data *)0x0)) {
          operator_delete(v0.d.d,0x10);
        }
      }
      bVar10 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                         (&(local_210.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
      if (!bVar10) {
        QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                  (&(local_210.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
      }
      LOCK();
      pQVar2 = &((local_210.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*((local_210.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])
                  (local_210.d);
      }
      local_240 = (PromiseData<int> *)local_2b0[0].d;
      if (local_238 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_238->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (local_238 != (PromiseData<int> *)0x0)) {
          (*(local_238->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
        }
      }
      local_258 = (PromiseData<int> *)local_2b0[0].d;
      if (local_250 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_250->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (local_250 != (PromiseData<int> *)0x0)) {
          (*(code *)((_List_node_base *)
                    (local_250->super_PromiseDataBase<int,_void_(const_int_&)>).
                    _vptr_PromiseDataBase)->_M_prev)();
        }
      }
      if (local_260 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_260->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i == 0) {
          (*(code *)((_List_node_base *)
                    (local_260->super_PromiseDataBase<int,_void_(const_int_&)>).
                    _vptr_PromiseDataBase)->_M_prev)();
        }
      }
      pPVar12 = (PromiseData<int> *)
                &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock;
      iVar19 = iVar19 + 1;
      local_210.d = pPVar13;
    } while (pPVar12 != p0.super_QPromiseBase<int>.m_d.d);
  }
  local_54 = 2;
  QtPromise::resolve<int>((int *)&local_c0);
  QtPromise::QPromiseBase<int>::tap<QtPromise::QPromiseBase<int>::delay(int)const::_lambda()_1_>
            (&local_170,(anon_class_4_1_898ef5c2)(int)&local_c0);
  p1_1.super_QPromiseBase<int>.m_d.d = local_170.m_d.d;
  QVar9 = p0.super_QPromiseBase<int>.m_d;
  local_170.m_d.d = (PromiseData<int> *)0x0;
  p1_1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)local_2b0[1].d;
  if ((PromiseData<int> *)p0.super_QPromiseBase<int>._vptr_QPromiseBase !=
      p0.super_QPromiseBase<int>.m_d.d) {
    iVar19 = 0;
    local_b0 = (_func_int **)&PTR__PromiseDataBase_0013e9a0;
    local_60 = (_func_int **)&PTR__PromiseData_0013e928;
    pp_Var20 = p0.super_QPromiseBase<int>._vptr_QPromiseBase;
    do {
      pPVar12 = (PromiseData<int> *)pp_Var20[1];
      if (pPVar12 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        pQVar2 = &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_258 = (PromiseData<int> *)local_2b0[1].d;
      local_248 = (_List_node_base *)&v1_1;
      local_238 = p1_1.super_QPromiseBase<int>.m_d.d;
      if (p1_1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &((p1_1.super_QPromiseBase<int>.m_d.d)->
                  super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_240 = (PromiseData<int> *)local_2b0[1].d;
      local_250 = pPVar12;
      local_230 = iVar19;
      pPVar13 = (PromiseData<int> *)operator_new(0x68);
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
           (_func_int **)0x0;
      *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData =
           0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
           (void *)0x0;
      (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
      *(undefined8 *)&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
      (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = local_b0;
      QReadWriteLock::QReadWriteLock
                (&(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
      QVar6.d = local_2b0[0].d;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
           (void *)0x0;
      (pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = local_60;
      (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (pPVar13->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      LOCK();
      pQVar2 = &(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      pQVar2 = &(pPVar13->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_208.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)local_2b0[1].d;
      local_260 = pPVar12;
      local_208.super_QPromiseBase<int>.m_d.d = pPVar13;
      QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_3,&local_208);
      local_208.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)QVar6.d;
      if (local_208.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &((local_208.super_QPromiseBase<int>.m_d.d)->
                  super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) &&
           (local_208.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
          (*((local_208.super_QPromiseBase<int>.m_d.d)->
            super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
        }
      }
      QVar8.d = p1_1.super_QPromiseBase<int>.m_d.d;
      if (resolver_3.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
        UNLOCK();
      }
      local_130 = resolver_3.m_d.d;
      if (resolver_3.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
        UNLOCK();
      }
      local_138 = resolver_3.m_d.d;
      d = (QArrayData *)resolver_3.m_d.d;
      if (resolver_3.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
        UNLOCK();
      }
      local_298.d = (PromiseData<int> *)resolver_3.m_d.d;
      if (resolver_3.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + 1;
        UNLOCK();
      }
      local_290.m_d.d = local_250;
      if (local_250 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_250->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_290._vptr_QPromiseBase = (_func_int **)local_2b0[1].d;
      local_280._vptr_QPromiseBase = (_func_int **)local_248;
      local_270 = local_238;
      if (local_238 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_238->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_280.m_d.d = (PromiseData<int> *)local_2b0[1].d;
      local_268 = local_230;
      inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
      inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
      _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
      inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
      _M_impl._M_node._M_size = 0;
      inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)operator_new(0x40);
      (inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>
       ._M_impl._M_node.super__List_node_base._M_next)->_M_next = (_List_node_base *)d;
      if (d != (QArrayData *)0x0) {
        LOCK();
        (d->ref_)._q_value.super___atomic_base<int>._M_i =
             (d->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      (inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>
       ._M_impl._M_node.super__List_node_base._M_next)->_M_prev = (_List_node_base *)local_298.d;
      if (local_298.d != (PromiseData<int> *)0x0) {
        LOCK();
        (((QAtomicInt *)
         &((local_298.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase)->
        super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
        _M_i = (((QAtomicInt *)
                &((local_298.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                 _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
               _q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
      _M_impl._M_node.super__List_node_base._M_next[1]._M_next = (_List_node_base *)local_2b0[0].d;
      inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
      _M_impl._M_node.super__List_node_base._M_next[1]._M_prev = (_List_node_base *)local_290.m_d.d;
      if (local_290.m_d.d != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &((local_290.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                  super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
      _M_impl._M_node.super__List_node_base._M_next[1]._M_next = (_List_node_base *)local_2b0[1].d;
      inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
      _M_impl._M_node.super__List_node_base._M_next[2]._M_next =
           (_List_node_base *)local_280._vptr_QPromiseBase;
      inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
      _M_impl._M_node.super__List_node_base._M_next[2]._M_prev = (_List_node_base *)local_2b0[0].d;
      inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
      _M_impl._M_node.super__List_node_base._M_next[3]._M_next = (_List_node_base *)local_270;
      if (local_270 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_270->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
      _M_impl._M_node.super__List_node_base._M_next[2]._M_prev = (_List_node_base *)local_2b0[1].d;
      *(int *)&inputs.
               super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>
               ._M_impl._M_node.super__List_node_base._M_next[3]._M_prev = local_268;
      inputs.super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
      _M_impl._M_node._M_size =
           (size_t)std::
                   _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                   ::_M_manager;
      local_280.m_d.d = (PromiseData<int> *)local_2b0[0].d;
      if (local_270 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_270->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (local_270 != (PromiseData<int> *)0x0)) {
          (*(local_270->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
        }
      }
      local_290._vptr_QPromiseBase = (_func_int **)local_2b0[0].d;
      if (local_290.m_d.d != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &((local_290.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                  super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (local_290.m_d.d != (PromiseData<int> *)0x0)) {
          (*(code *)((_List_node_base *)
                    ((local_290.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                    _vptr_PromiseDataBase)->_M_prev)();
        }
      }
      if (local_298.d != (PromiseData<int> *)0x0) {
        LOCK();
        (((QAtomicInt *)
         &((local_298.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase)->
        super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
        _M_i = (((QAtomicInt *)
                &((local_298.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
                 _vptr_PromiseDataBase)->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>.
               _q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((((QAtomicInt *)
              &((local_298.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase
              )->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (local_298.d != (PromiseData<int> *)0x0)) {
          operator_delete(local_298.d,0x10);
        }
      }
      if (d != (QArrayData *)0x0) {
        LOCK();
        (d->ref_)._q_value.super___atomic_base<int>._M_i =
             (d->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((d->ref_)._q_value.super___atomic_base<int>._M_i == 0) && (d != (QArrayData *)0x0)) {
          operator_delete(d,0x10);
        }
      }
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
                (&(QVar8.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
                 (function<void_(const_int_&)> *)&inputs);
      if (inputs.
          super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>.
          _M_impl._M_node._M_size != 0) {
        (*(code *)inputs.
                  super__List_base<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>
                  ._M_impl._M_node._M_size)(&inputs,&inputs,3);
      }
      QVar8.d = p1_1.super_QPromiseBase<int>.m_d.d;
      QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
      create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
                ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&v0,
                 (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_130,
                 (QPromiseResolve<int> *)&local_138,(QPromiseReject<int> *)reject);
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
                (&(QVar8.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
                 (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&v0);
      if (v0.d.size != 0) {
        (*(code *)v0.d.size)(&v0,&v0,3);
      }
      if (local_138.d != (Data *)0x0) {
        LOCK();
        ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)
              ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
              super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
        UNLOCK();
        if (((__int_type)
             ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
           (local_138.d != (Data *)0x0)) {
          operator_delete(local_138.d,0x10);
        }
      }
      if (local_130.d != (Data *)0x0) {
        LOCK();
        ((local_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             ((local_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((local_130.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
           (local_130.d != (Data *)0x0)) {
          operator_delete(local_130.d,0x10);
        }
      }
      if (resolver_3.m_d.d != (Data *)0x0) {
        LOCK();
        *(int *)resolver_3.m_d.d = *(int *)resolver_3.m_d.d + -1;
        UNLOCK();
        if ((*(int *)resolver_3.m_d.d == 0) && (resolver_3.m_d.d != (Data *)0x0)) {
          operator_delete((void *)resolver_3.m_d.d,0x10);
        }
      }
      QVar8.d = p1_1.super_QPromiseBase<int>.m_d.d;
      bVar10 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                         (&(p1_1.super_QPromiseBase<int>.m_d.d)->
                           super_PromiseDataBase<int,_void_(const_int_&)>);
      if (!bVar10) {
        QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                  (&(QVar8.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
      }
      LOCK();
      pQVar2 = &((QVar8.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      p1_1.super_QPromiseBase<int>.m_d.d = pPVar13;
      if ((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i == 0) {
        (*((QVar8.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])
                  (QVar8.d);
      }
      local_240 = (PromiseData<int> *)local_2b0[0].d;
      if (local_238 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_238->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (local_238 != (PromiseData<int> *)0x0)) {
          (*(local_238->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
        }
      }
      pPVar12 = local_260;
      local_258 = (PromiseData<int> *)local_2b0[0].d;
      if (local_250 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(local_250->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i == 0) && (local_250 != (PromiseData<int> *)0x0)) {
          (*(code *)((_List_node_base *)
                    (local_250->super_PromiseDataBase<int,_void_(const_int_&)>).
                    _vptr_PromiseDataBase)->_M_prev)();
        }
      }
      if (pPVar12 != (PromiseData<int> *)0x0) {
        LOCK();
        pQVar2 = &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i == 0) {
          (*(code *)((_List_node_base *)
                    (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase)
                    ->_M_prev)(pPVar12);
        }
      }
      pp_Var20 = pp_Var20 + 2;
      iVar19 = iVar19 + 1;
    } while ((PromiseData<int> *)pp_Var20 != QVar9.d);
  }
  local_170._vptr_QPromiseBase = (_func_int **)local_2b0[0].d;
  if (local_170.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &((local_170.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_170.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_170.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1]
      )();
    }
  }
  local_c0 = (PromiseData<int> *)local_2b0[0].d;
  if (local_b8 != (long *)0x0) {
    LOCK();
    plVar5 = local_b8 + 1;
    *(int *)plVar5 = (int)*plVar5 + -1;
    UNLOCK();
    if (((int)*plVar5 == 0) && (local_b8 != (long *)0x0)) {
      (**(code **)(*local_b8 + 8))();
    }
  }
  bVar10 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                     (&(local_210.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  d = (QArrayData *)CONCAT71(d._1_7_,bVar10);
  local_258._0_1_ = 1;
  pcVar14 = QTest::toString<bool>((bool *)&d);
  pcVar15 = QTest::toString<bool>((bool *)&local_258);
  cVar11 = QTest::compare_helper
                     (bVar10,"Compared values are not the same",pcVar14,pcVar15,"p0.isPending()",
                      "true",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                      ,0x3d);
  if (cVar11 != '\0') {
    bVar10 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                       (&(p1_1.super_QPromiseBase<int>.m_d.d)->
                         super_PromiseDataBase<int,_void_(const_int_&)>);
    d = (QArrayData *)CONCAT71(d._1_7_,bVar10);
    local_258._0_1_ = 1;
    pcVar14 = QTest::toString<bool>((bool *)&d);
    pcVar15 = QTest::toString<bool>((bool *)&local_258);
    cVar11 = QTest::compare_helper
                       (bVar10,"Compared values are not the same",pcVar14,pcVar15,"p1.isPending()",
                        "true",
                        "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                        ,0x3e);
    if (cVar11 != '\0') {
      d = (QArrayData *)CONCAT44(d._4_4_,0xffffffff);
      iVar19 = waitForValue<int>((QPromise<int> *)&resolver_1,(int *)&d);
      cVar11 = QTest::qCompare(iVar19,0x15,"waitForValue(p0, -1)","21",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                               ,0x3f);
      if (cVar11 != '\0') {
        d = (QArrayData *)CONCAT44(d._4_4_,0xffffffff);
        iVar19 = waitForValue<int>(&p1_1,(int *)&d);
        cVar11 = QTest::qCompare(iVar19,0x17,"waitForValue(p1, -1)","23",
                                 "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                                 ,0x40);
        if (cVar11 != '\0') {
          cVar16.i = (int *)QArrayData::allocate(&d,4,8,6,KeepSize);
          pQVar7 = d;
          cVar16.i[0] = 4;
          cVar16.i[1] = 6;
          cVar16.i[2] = 1;
          cVar16.i[3] = 0xb;
          cVar16.i[4] = 8;
          cVar16.i[5] = 2;
          bVar10 = QTest::_q_compareSequence<QList<int>::const_iterator,QList<int>::const_iterator>
                             ((const_iterator)p1.super_QPromiseBase<int>.m_d.d,
                              (const_iterator)p1.super_QPromiseBase<int>.m_d.d,cVar16,
                              (const_iterator)(cVar16.i + 6),"v0",
                              "(QVector<int>{4, 6, 1, 11, 8, 2})",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                              ,0x41);
          if (pQVar7 != (QArrayData *)0x0) {
            LOCK();
            (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
                 (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
              QArrayData::deallocate(pQVar7,4,8);
            }
          }
          if (bVar10) {
            cVar16.i = (int *)QArrayData::allocate(&d,4,8,9,KeepSize);
            pQVar7 = d;
            cVar16.i[4] = 6;
            cVar16.i[5] = 1;
            cVar16.i[6] = 0xd;
            cVar16.i[7] = 8;
            cVar16.i[0] = 2;
            cVar16.i[1] = 4;
            cVar16.i[2] = 0;
            cVar16.i[3] = 6;
            cVar16.i[8] = 2;
            QTest::_q_compareSequence<QList<int>::const_iterator,QList<int>::const_iterator>
                      ((const_iterator)v1_1.d.ptr,(const_iterator)(v1_1.d.ptr + v1_1.d.size),cVar16,
                       (const_iterator)(cVar16.i + 9),"v1",
                       "(QVector<int>{2, 4, 0, 6, 6, 1, 13, 8, 2})",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_reduce.cpp"
                       ,0x42);
            if (pQVar7 != (QArrayData *)0x0) {
              LOCK();
              (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
                   (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(pQVar7,4,8);
              }
            }
          }
        }
      }
    }
  }
  p1_1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)local_2b0[0].d;
  if (p1_1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &((p1_1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>)
              .super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p1_1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p1_1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)local_2b0[0].d;
  if (local_210.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar2 = &((local_210.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_210.d != (PromiseData<int> *)0x0)) {
      (*((local_210.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  if (v1_1.d.d != (Data *)0x0) {
    LOCK();
    ((v1_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((v1_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((v1_1.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(v1_1.d.d)->super_QArrayData,4,8);
    }
  }
  if (p1.super_QPromiseBase<int>._vptr_QPromiseBase != (_func_int **)0x0) {
    LOCK();
    *(int *)p1.super_QPromiseBase<int>._vptr_QPromiseBase =
         *(int *)p1.super_QPromiseBase<int>._vptr_QPromiseBase + -1;
    UNLOCK();
    if (*(int *)p1.super_QPromiseBase<int>._vptr_QPromiseBase == 0) {
      QArrayData::deallocate((QArrayData *)p1.super_QPromiseBase<int>._vptr_QPromiseBase,4,8);
    }
  }
  std::vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_>::~vector
            ((vector<QtPromise::QPromise<int>,_std::allocator<QtPromise::QPromise<int>_>_> *)&p0);
  return;
}

Assistant:

void tst_helpers_reduce::sequenceTypes()
{
#if (QT_VERSION < QT_VERSION_CHECK(5, 15, 0))
    // QLinkedList is deprecated since Qt 5.15.
    SequenceTester<QLinkedList<QtPromise::QPromise<int>>>::exec();
#endif
    SequenceTester<QList<QtPromise::QPromise<int>>>::exec();
    SequenceTester<QVector<QtPromise::QPromise<int>>>::exec();
    SequenceTester<std::list<QtPromise::QPromise<int>>>::exec();
    SequenceTester<std::vector<QtPromise::QPromise<int>>>::exec();
}